

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rephase.cpp
# Opt level: O0

void __thiscall CaDiCaL::Internal::rephase(Internal *this)

{
  ulong uVar1;
  uint uVar2;
  Internal *pIVar3;
  long lVar4;
  ulong uVar5;
  long in_RDI;
  bool bVar6;
  Internal *in_stack_00000010;
  Internal *in_stack_00000020;
  int64_t delta;
  char type;
  bool single;
  size_t count;
  int in_stack_00000498;
  char in_stack_0000049f;
  Internal *in_stack_000004a0;
  Internal *in_stack_ffffffffffffff90;
  Internal *in_stack_ffffffffffffffa0;
  Internal *in_stack_ffffffffffffffb0;
  vector<signed_char,_std::allocator<signed_char>_> *in_stack_ffffffffffffffc8;
  Internal *in_stack_ffffffffffffffd0;
  char local_12;
  
  *(long *)(in_RDI + 0x1120) = *(long *)(in_RDI + 0x1120) + 1;
  if (*(long *)(in_RDI + 0x1c50) != 0) {
    phase(*(Internal **)(in_RDI + 0x1c50),"rephase",*(int64_t *)(in_RDI + 0x1120),
          "reached rephase limit %ld after %ld conflicts",*(undefined8 *)(in_RDI + 0xb48),
          *(undefined8 *)(in_RDI + 0xf58));
  }
  report(in_stack_000004a0,in_stack_0000049f,in_stack_00000498);
  backtrack(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  clear_phases(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *(undefined8 *)(in_RDI + 0x418) = 0;
  uVar5 = (ulong)(*(byte *)(in_RDI + 0xc) & 1);
  uVar1 = *(ulong *)(in_RDI + 0xb78 + uVar5 * 8);
  *(ulong *)(in_RDI + 0xb78 + uVar5 * 8) = uVar1 + 1;
  if ((*(int *)(in_RDI + 0xe98) == 0) || (*(int *)(in_RDI + 0xea8) == 0)) {
    bVar6 = *(int *)(in_RDI + 0xe98) == 0;
  }
  else {
    bVar6 = true;
  }
  uVar2 = (uint)uVar1;
  if ((bVar6) && (*(int *)(in_RDI + 0xf30) == 0)) {
    switch(uVar2 & 7) {
    case 0:
      local_12 = rephase_inverted(in_stack_ffffffffffffffb0);
      break;
    case 1:
      local_12 = rephase_best(in_stack_ffffffffffffffb0);
      break;
    case 2:
      local_12 = rephase_flipping(in_stack_ffffffffffffffa0);
      break;
    case 3:
      local_12 = rephase_best(in_stack_ffffffffffffffb0);
      break;
    case 4:
      local_12 = rephase_random(in_stack_ffffffffffffffb0);
      break;
    case 5:
      local_12 = rephase_best(in_stack_ffffffffffffffb0);
      break;
    case 6:
      local_12 = rephase_original(in_stack_ffffffffffffffb0);
      break;
    case 7:
      local_12 = rephase_best(in_stack_ffffffffffffffb0);
      break;
    default:
      local_12 = '\0';
    }
  }
  else if ((bVar6) && (*(int *)(in_RDI + 0xf30) != 0)) {
    switch(uVar1 + (uVar1 / 3 & 0xfffffffffffffffc) * -3) {
    case 0:
      local_12 = rephase_inverted(in_stack_ffffffffffffffb0);
      break;
    case 1:
      local_12 = rephase_best(in_stack_ffffffffffffffb0);
      break;
    case 2:
      local_12 = rephase_walk(in_stack_ffffffffffffff90);
      break;
    case 3:
      local_12 = rephase_flipping(in_stack_ffffffffffffffa0);
      break;
    case 4:
      local_12 = rephase_best(in_stack_ffffffffffffffb0);
      break;
    case 5:
      local_12 = rephase_walk(in_stack_ffffffffffffff90);
      break;
    case 6:
      local_12 = rephase_random(in_stack_ffffffffffffffb0);
      break;
    case 7:
      local_12 = rephase_best(in_stack_ffffffffffffffb0);
      break;
    case 8:
      local_12 = rephase_walk(in_stack_ffffffffffffff90);
      break;
    case 9:
      local_12 = rephase_original(in_stack_ffffffffffffffb0);
      break;
    case 10:
      local_12 = rephase_best(in_stack_ffffffffffffffb0);
      break;
    case 0xb:
      local_12 = rephase_walk(in_stack_ffffffffffffff90);
      break;
    default:
      local_12 = '\0';
    }
  }
  else if (((*(byte *)(in_RDI + 0xc) & 1) == 0) || (*(int *)(in_RDI + 0xf30) != 0)) {
    if (((*(byte *)(in_RDI + 0xc) & 1) == 0) || (*(int *)(in_RDI + 0xf30) == 0)) {
      if (((*(byte *)(in_RDI + 0xc) & 1) == 0) &&
         ((*(int *)(in_RDI + 0xf30) == 0 || (*(int *)(in_RDI + 0xf3c) == 0)))) {
        if (uVar1 == 0) {
          local_12 = rephase_flipping(in_stack_ffffffffffffffa0);
        }
        else {
          pIVar3 = (Internal *)(ulong)(uVar2 - 1 & 3);
          switch(pIVar3) {
          case (Internal *)0x0:
            local_12 = rephase_random(in_stack_ffffffffffffffb0);
            break;
          case (Internal *)0x1:
            local_12 = rephase_best(in_stack_ffffffffffffffb0);
            break;
          case (Internal *)0x2:
            local_12 = rephase_flipping(pIVar3);
            break;
          case (Internal *)0x3:
            local_12 = rephase_best(in_stack_ffffffffffffffb0);
            break;
          default:
            local_12 = '\0';
          }
        }
      }
      else if (uVar1 == 0) {
        local_12 = rephase_flipping(in_stack_ffffffffffffffa0);
      }
      else {
        pIVar3 = (Internal *)(uVar1 - 1);
        switch((long)pIVar3 + ((ulong)pIVar3 / 3 & 0xfffffffffffffffe) * -3) {
        case 0:
          local_12 = rephase_random(in_stack_ffffffffffffffb0);
          break;
        case 1:
          local_12 = rephase_best(in_stack_ffffffffffffffb0);
          break;
        case 2:
          local_12 = rephase_walk(pIVar3);
          break;
        case 3:
          local_12 = rephase_flipping(in_stack_ffffffffffffffa0);
          break;
        case 4:
          local_12 = rephase_best(in_stack_ffffffffffffffb0);
          break;
        case 5:
          local_12 = rephase_walk(pIVar3);
          break;
        default:
          local_12 = '\0';
        }
      }
    }
    else if (uVar1 == 0) {
      local_12 = rephase_original(in_stack_ffffffffffffffb0);
    }
    else if (uVar1 == 1) {
      local_12 = rephase_inverted(in_stack_ffffffffffffffb0);
    }
    else {
      pIVar3 = (Internal *)((uVar1 - 2) + ((uVar1 - 2) / 3 & 0xfffffffffffffffe) * -3);
      switch(pIVar3) {
      case (Internal *)0x0:
        local_12 = rephase_best(pIVar3);
        break;
      case (Internal *)0x1:
        local_12 = rephase_walk(in_stack_ffffffffffffff90);
        break;
      case (Internal *)0x2:
        local_12 = rephase_original(pIVar3);
        break;
      case (Internal *)0x3:
        local_12 = rephase_best(pIVar3);
        break;
      case (Internal *)0x4:
        local_12 = rephase_walk(in_stack_ffffffffffffff90);
        break;
      case (Internal *)0x5:
        local_12 = rephase_inverted(pIVar3);
        break;
      default:
        local_12 = '\0';
      }
    }
  }
  else if (uVar1 == 0) {
    local_12 = rephase_original(in_stack_ffffffffffffffb0);
  }
  else if (uVar1 == 1) {
    local_12 = rephase_inverted(in_stack_ffffffffffffffb0);
  }
  else {
    switch(uVar2 - 2 & 3) {
    case 0:
      local_12 = rephase_best(in_stack_ffffffffffffffb0);
      break;
    case 1:
      local_12 = rephase_original(in_stack_ffffffffffffffb0);
      break;
    case 2:
      local_12 = rephase_best(in_stack_ffffffffffffffb0);
      break;
    case 3:
      local_12 = rephase_inverted(in_stack_ffffffffffffffb0);
      break;
    default:
      local_12 = '\0';
    }
  }
  lVar4 = (long)*(int *)(in_RDI + 0xe48) * (*(long *)(in_RDI + 0x1120) + 1);
  *(long *)(in_RDI + 0xb48) = *(long *)(in_RDI + 0xf58) + lVar4;
  if (*(long *)(in_RDI + 0x1c50) != 0) {
    phase(*(Internal **)(in_RDI + 0x1c50),"rephase",*(int64_t *)(in_RDI + 0x1120),
          "new rephase limit %ld after %ld conflicts",*(undefined8 *)(in_RDI + 0xb48),lVar4);
  }
  *(undefined8 *)(in_RDI + 0xbd8) = *(undefined8 *)(in_RDI + 0xf58);
  *(char *)(in_RDI + 0x13) = local_12;
  if ((*(byte *)(in_RDI + 0xc) & 1) == 0) {
    shuffle_queue(in_stack_00000020);
  }
  else {
    shuffle_scores(in_stack_00000010);
  }
  return;
}

Assistant:

void Internal::rephase () {

  stats.rephased.total++;
  PHASE ("rephase", stats.rephased.total,
         "reached rephase limit %" PRId64 " after %" PRId64 " conflicts",
         lim.rephase, stats.conflicts);

  // Report current 'target' and 'best' and then set 'rephased' below, which
  // will trigger reporting the new 'target' and 'best' after updating it in
  // the next 'update_target_and_best' called from the next 'backtrack'.
  //
  report ('~', 1);

  backtrack ();
  clear_phases (phases.target);
  target_assigned = 0;

  size_t count = lim.rephased[stable]++;
  bool single;
  char type;

  if (opts.stabilize && opts.stabilizeonly)
    single = true;
  else
    single = !opts.stabilize;

  if (single && !opts.walk) {
    // (inverted,best,flipping,best,random,best,original,best)^\omega
    switch (count % 8) {
    case 0:
      type = rephase_inverted ();
      break;
    case 1:
      type = rephase_best ();
      break;
    case 2:
      type = rephase_flipping ();
      break;
    case 3:
      type = rephase_best ();
      break;
    case 4:
      type = rephase_random ();
      break;
    case 5:
      type = rephase_best ();
      break;
    case 6:
      type = rephase_original ();
      break;
    case 7:
      type = rephase_best ();
      break;
    default:
      type = 0;
      break;
    }
  } else if (single && opts.walk) {
    // (inverted,best,walk,
    //  flipping,best,walk,
    //    random,best,walk,
    //  original,best,walk)^\omega
    switch (count % 12) {
    case 0:
      type = rephase_inverted ();
      break;
    case 1:
      type = rephase_best ();
      break;
    case 2:
      type = rephase_walk ();
      break;
    case 3:
      type = rephase_flipping ();
      break;
    case 4:
      type = rephase_best ();
      break;
    case 5:
      type = rephase_walk ();
      break;
    case 6:
      type = rephase_random ();
      break;
    case 7:
      type = rephase_best ();
      break;
    case 8:
      type = rephase_walk ();
      break;
    case 9:
      type = rephase_original ();
      break;
    case 10:
      type = rephase_best ();
      break;
    case 11:
      type = rephase_walk ();
      break;
    default:
      type = 0;
      break;
    }
  } else if (stable && !opts.walk) {
    // original,inverted,(best,original,best,inverted)^\omega
    if (!count)
      type = rephase_original ();
    else if (count == 1)
      type = rephase_inverted ();
    else
      switch ((count - 2) % 4) {
      case 0:
        type = rephase_best ();
        break;
      case 1:
        type = rephase_original ();
        break;
      case 2:
        type = rephase_best ();
        break;
      case 3:
        type = rephase_inverted ();
        break;
      default:
        type = 0;
        break;
      }
  } else if (stable && opts.walk) {
    // original,inverted,(best,walk,original,best,walk,inverted)^\omega
    if (!count)
      type = rephase_original ();
    else if (count == 1)
      type = rephase_inverted ();
    else
      switch ((count - 2) % 6) {
      case 0:
        type = rephase_best ();
        break;
      case 1:
        type = rephase_walk ();
        break;
      case 2:
        type = rephase_original ();
        break;
      case 3:
        type = rephase_best ();
        break;
      case 4:
        type = rephase_walk ();
        break;
      case 5:
        type = rephase_inverted ();
        break;
      default:
        type = 0;
        break;
      }
  } else if (!stable && (!opts.walk || !opts.walknonstable)) {
    // flipping,(random,best,flipping,best)^\omega
    if (!count)
      type = rephase_flipping ();
    else
      switch ((count - 1) % 4) {
      case 0:
        type = rephase_random ();
        break;
      case 1:
        type = rephase_best ();
        break;
      case 2:
        type = rephase_flipping ();
        break;
      case 3:
        type = rephase_best ();
        break;
      default:
        type = 0;
        break;
      }
  } else {
    assert (!stable && opts.walk && opts.walknonstable);
    // flipping,(random,best,walk,flipping,best,walk)^\omega
    if (!count)
      type = rephase_flipping ();
    else
      switch ((count - 1) % 6) {
      case 0:
        type = rephase_random ();
        break;
      case 1:
        type = rephase_best ();
        break;
      case 2:
        type = rephase_walk ();
        break;
      case 3:
        type = rephase_flipping ();
        break;
      case 4:
        type = rephase_best ();
        break;
      case 5:
        type = rephase_walk ();
        break;
      default:
        type = 0;
        break;
      }
  }
  assert (type);

  int64_t delta = opts.rephaseint * (stats.rephased.total + 1);
  lim.rephase = stats.conflicts + delta;

  PHASE ("rephase", stats.rephased.total,
         "new rephase limit %" PRId64 " after %" PRId64 " conflicts",
         lim.rephase, delta);

  // This will trigger to report the effect of this new set of phases at the
  // 'backtrack' (actually 'update_target_and_best') after the next
  // conflict, as well as resetting 'best_assigned' then to allow to compute
  // a new "best" assignment at that point.
  //
  last.rephase.conflicts = stats.conflicts;
  rephased = type;

  if (stable)
    shuffle_scores ();
  else
    shuffle_queue ();
}